

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

void do_osshock(obj *obj)

{
  boolean bVar1;
  int iVar2;
  long local_18;
  long i;
  obj *obj_local;
  
  obj_zapped = '\x01';
  if (poly_zapped < 0) {
    for (local_18 = (long)obj->quan; local_18 != 0; local_18 = local_18 + -1) {
      iVar2 = rn2((int)u.uluck + (int)u.moreluck + 0x2d);
      if (iVar2 == 0) {
        poly_zapped = (int)(*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f);
        break;
      }
    }
  }
  i = (long)obj;
  if (1 < obj->quan) {
    if (obj->quan < 0x8000) {
      iVar2 = rnd(obj->quan + -1);
      i = (long)splitobj(obj,(long)iVar2);
    }
    else {
      iVar2 = rnd(30000);
      i = (long)splitobj(obj,(long)iVar2);
    }
  }
  bVar1 = costly_spot(*(xchar *)(i + 0x28),*(xchar *)(i + 0x29));
  if (bVar1 != '\0') {
    if (u.ushops[0] == '\0') {
      stolen_value((obj *)i,*(xchar *)(i + 0x28),*(xchar *)(i + 0x29),'\0','\0');
    }
    else {
      addtobill((obj *)i,'\0','\0','\0');
    }
  }
  delobj((obj *)i);
  return;
}

Assistant:

void do_osshock(struct obj *obj)
{
	long i;

	obj_zapped = TRUE;

	if (poly_zapped < 0) {
	    /* some may metamorphosize */
	    for (i = obj->quan; i; i--)
		if (! rn2(Luck + 45)) {
		    poly_zapped = objects[obj->otyp].oc_material;
		    break;
		}
	}

	/* if quan > 1 then some will survive intact */
	if (obj->quan > 1L) {
	    if (obj->quan > LARGEST_INT)
		obj = splitobj(obj, (long)rnd(30000));
	    else
		obj = splitobj(obj, (long)rnd((int)obj->quan - 1));
	}

	/* appropriately add damage to bill */
	if (costly_spot(obj->ox, obj->oy)) {
		if (*u.ushops)
			addtobill(obj, FALSE, FALSE, FALSE);
		else
			stolen_value(obj,
					   obj->ox, obj->oy, FALSE, FALSE);
	}

	/* zap the object */
	delobj(obj);
}